

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naiveproxy.cpp
# Opt level: O3

int __thiscall naiveproxy::open_only_once(naiveproxy *this)

{
  int __fd;
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  char local_3a [8];
  char buf [10];
  
  __fd = open("/tmp/naiveproxy.pid",0x41,0x1a4);
  if (__fd < 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = fcntl(__fd,6);
    if (iVar1 < 0) {
      piVar6 = __errno_location();
      if ((*piVar6 == 0xd) || (iVar1 = -1, *piVar6 == 0xb)) {
        puts("naiveproxy has already run.");
        exit(-1);
      }
    }
    else {
      iVar2 = ftruncate(__fd,0);
      iVar1 = -1;
      if (-1 < iVar2) {
        uVar3 = getpid();
        sprintf(local_3a,"%d\n",(ulong)uVar3);
        sVar4 = strlen(local_3a);
        sVar4 = write(__fd,local_3a,sVar4);
        sVar5 = strlen(local_3a);
        if (sVar4 == sVar5) {
          uVar3 = fcntl(__fd,1,0);
          if (-1 < (int)uVar3) {
            iVar2 = fcntl(__fd,2,(ulong)(uVar3 | 1));
            if (-1 < iVar2) {
              this->oncefd = __fd;
              iVar1 = __fd;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int naiveproxy::open_only_once()
{
    const char filename[] = "/tmp/naiveproxy.pid";
    int fd, val;
    char buf[10];
    //打开控制文件，控制文件打开方式：O_WRONLY | O_CREAT只写创建方式
    //控制文件权限：S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH用户、用户组读写权限
    if ((fd = open(filename, O_WRONLY | O_CREAT, S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH)) < 0)
    {
        return -1;
    }
    // try and set a write lock on the entire file
    struct flock lock;
    //建立一个供写入用的锁
    lock.l_type = F_WRLCK;
    lock.l_start = 0;
    //以文件开头为锁定的起始位置
    lock.l_whence = SEEK_SET;
    lock.l_len = 0;
    //结合lock中设置的锁类型，控制文件设置文件锁，此处设置写文件锁
    if (fcntl(fd, F_SETLK, &lock) < 0)
    {
        //如果获取写文件锁成功，则退出当前进程，保留后台进程
        if (errno == EACCES || errno == EAGAIN)
        {
            printf("naiveproxy has already run.\n");
            exit(-1); // gracefully exit, daemon is already running
        }
        else
        {
            //   printf("file being used\n");
            return -1; //如果锁被其他进程占用，返回 -1
        }
    }
    // truncate to zero length, now that we have the lock
    //改变文件大小为0
    if (ftruncate(fd, 0) < 0)
        return -1;
    // and write our process ID
    //获取当前进程pid
    sprintf(buf, "%d\n", getpid());
    //将启动成功的进程pid写入控制文件
    if (write(fd, buf, strlen(buf)) != (ssize_t)strlen(buf))
        return -1;

    // set close-on-exec flag for descriptor
    // 获取当前文件描述符close-on-exec标记
    if ((val = fcntl(fd, F_GETFD, 0)) < 0)
        return -1;
    val |= FD_CLOEXEC;
    //关闭进程无用文件描述符
    if (fcntl(fd, F_SETFD, val) < 0)
        return -1;
    // leave file open until we terminate: lock will be held

    oncefd = fd;

    return fd;
}